

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedList.c
# Opt level: O3

void rmlLinkedListDestroy(void *self)

{
  long lVar1;
  rmlLinkedList *selfList;
  
  lVar1 = *(long *)((long)self + 0x10);
  while (lVar1 != 0) {
    if (*(void **)((long)self + 8) != (void *)0x0) {
      rmlLinkedListRemoveItem(self,*(void **)((long)self + 8));
      lVar1 = *(long *)((long)self + 0x10);
    }
  }
  free(self);
  return;
}

Assistant:

void rmlLinkedListDestroy(void *self) {
    struct rmlLinkedList *m = self;

    while (rmlLinkedListGetLength(self)) {
        rmlLinkedListPop(self);
    }

    rmlLinkedListReset(self);
    RML_VERBOSE("Destroy LinkedList(0x%llx)", (uint64_t) m)
    free(m);
}